

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall Js::FunctionBody::DoStackScopeSlots(FunctionBody *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  byte local_11;
  FunctionBody *this_local;
  
  bVar1 = DoStackClosure<Js::FunctionBody_const*>(this);
  local_11 = 0;
  if (bVar1) {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackClosurePhase,sourceContextId,functionId);
    local_11 = bVar1 ^ 0xff;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool DoStackScopeSlots() const { return DoStackClosure(this) && !PHASE_OFF(StackClosurePhase, this); }